

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<float,_10>::TPZManVector(TPZManVector<float,_10> *this,TPZManVector<float,_10> *rval)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  float *pfVar4;
  
  (this->super_TPZVec<float>).fStore = (float *)0x0;
  (this->super_TPZVec<float>).fNElements = 0;
  (this->super_TPZVec<float>).fNAlloc = 0;
  (this->super_TPZVec<float>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181a118;
  uVar1 = (rval->super_TPZVec<float>).fNElements;
  if (10 < (long)uVar1) {
    pfVar4 = (rval->super_TPZVec<float>).fStore;
    uVar3 = uVar1;
    goto LAB_00b2dd8f;
  }
  uVar3 = 0;
  iVar2 = 0;
  if ((long)uVar1 < 1) {
LAB_00b2dd63:
    memset((void *)((long)this->fExtAlloc + (ulong)(uint)(iVar2 * 4)),0,
           (ulong)(iVar2 * -4 + 0x24) + 4);
  }
  else {
    do {
      this->fExtAlloc[uVar3] = rval->fExtAlloc[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    iVar2 = (int)uVar1;
    if (uVar1 < 10) goto LAB_00b2dd63;
  }
  pfVar4 = this->fExtAlloc;
  uVar3 = 0;
LAB_00b2dd8f:
  (this->super_TPZVec<float>).fStore = pfVar4;
  (this->super_TPZVec<float>).fNElements = uVar1;
  (this->super_TPZVec<float>).fNAlloc = uVar3;
  (rval->super_TPZVec<float>).fStore = (float *)0x0;
  (rval->super_TPZVec<float>).fNElements = 0;
  (rval->super_TPZVec<float>).fNAlloc = 0;
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(TPZManVector< T, NumExtAlloc >&& rval) {

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (auto size = rval.NElements();size <= NumExtAlloc){
        //we need to copy, unfortunately
        int i = 0;
        for(; i < size; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else {// The size requested is bigger than the size already provided.
        this->fStore = rval.fStore;
        this->fNElements = size;
        this->fNAlloc = size;
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
}